

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O3

undefined4 __thiscall
despot::RockSampleEastBeliefPolicy::Value(RockSampleEastBeliefPolicy *this,Belief *belief)

{
  BaseRockSample *pBVar1;
  undefined8 *puVar2;
  double dVar3;
  undefined4 local_18 [4];
  
  puVar2 = (undefined8 *)(**(code **)(*(long *)belief + 0x30))(belief);
  pBVar1 = this->rs_model_;
  dVar3 = pow(_ParticleBelief,
              (double)(~((*(int *)(*(long *)*puVar2 + 0xc) >> ((byte)pBVar1->num_rocks_ & 0x1f)) %
                        (pBVar1->grid_).xsize_) + pBVar1->size_));
  despot::ValuedAction::ValuedAction((ValuedAction *)local_18,1,dVar3 * 10.0);
  return local_18[0];
}

Assistant:

ValuedAction Value(const Belief* belief) const {
		const vector<State*>& particles =
			static_cast<const ParticleBelief*>(belief)->particles();
		return ValuedAction(Compass::EAST,
			Globals::Discount(rs_model_->size_ - rs_model_->GetX(particles[0]) - 1) * 10);
	}